

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  big_decimal_fp *pbVar1;
  locale_ref loc_00;
  int iVar2;
  char cVar3;
  bool bVar4;
  type tVar5;
  type tVar6;
  int iVar7;
  appender aVar8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  sign_t sVar16;
  uint uVar17;
  locale_ref in_stack_fffffffffffffee8;
  char local_10b;
  sign_t sign;
  char zero;
  bool pointy;
  undefined3 uStack_107;
  int significand_size;
  ulong local_100;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_f8;
  undefined8 local_f0;
  basic_format_specs<char> *local_e8;
  locale_ref local_e0;
  ulong local_d8;
  char *significand;
  int local_c8;
  int exp;
  char *local_c0;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = f->significand;
  iVar7 = f->significand_size;
  zero = '0';
  sVar16 = fspecs._5_1_;
  sign = sVar16;
  significand_size = iVar7;
  local_f8 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_f0 = f;
  local_e8 = specs;
  local_c0 = significand;
  fspecs_local = fspecs;
  tVar5 = to_unsigned<int>(iVar7);
  local_100 = (ulong)((tVar5 + 1) - (uint)(sVar16 == none));
  cVar3 = '.';
  local_d8 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    cVar3 = decimal_point_impl<char>(in_stack_fffffffffffffee8);
  }
  pbVar1 = local_f0;
  iVar15 = local_f0->exponent;
  local_c8 = iVar15 + iVar7 + -1;
  local_10b = cVar3;
  local_e0.locale_ = loc.locale_;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_c8;
  bVar4 = do_write_float<fmt::v9::appender,_fmt::v9::detail::big_decimal_fp,_char,_fmt::v9::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar13 = local_100;
  uVar12 = fspecs.precision;
  uVar10 = (uint)local_d8;
  if (bVar4) {
    iVar15 = iVar15 + iVar7;
    if ((uVar10 >> 0x13 & 1) == 0) {
      local_f0 = (big_decimal_fp *)((ulong)local_f0._4_4_ << 0x20);
      if (iVar7 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      iVar11 = 0;
      if (0 < (int)(uVar12 - iVar7)) {
        iVar11 = uVar12 - iVar7;
      }
      local_f0 = (big_decimal_fp *)CONCAT44(local_f0._4_4_,iVar11);
      tVar5 = to_unsigned<int>(iVar11);
      uVar13 = local_100 + tVar5;
    }
    iVar2 = local_c8;
    iVar11 = 1 - iVar15;
    if (0 < iVar15) {
      iVar11 = local_c8;
    }
    iVar15 = 2;
    if (99 < iVar11) {
      iVar15 = (999 < iVar11) + 3;
    }
    tVar5 = to_unsigned<int>((3 - (uint)(cVar3 == '\0')) + iVar15);
    write.sign = sVar16;
    write.significand = local_c0;
    write.decimal_point = cVar3;
    write.significand_size = iVar7;
    write._24_5_ = CONCAT14('0',(int)local_f0);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar10 >> 0x10 & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = iVar2;
    if (0 < local_e8->width) {
      aVar8 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)local_f8.container,local_e8,uVar13 + tVar5,&write);
      return (appender)
             aVar8.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    aVar8 = do_write_float<fmt::v9::appender,_fmt::v9::detail::big_decimal_fp,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()(&write,(iterator)local_f8.container);
    return (appender)
           aVar8.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  iVar11 = pbVar1->exponent;
  iVar15 = iVar11 + iVar7;
  exp = iVar15;
  if (iVar11 < 0) {
    if (iVar15 < 1) {
      uVar17 = -iVar15;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar17;
      if (uVar12 < uVar17) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar12;
      }
      if ((int)uVar12 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar17;
      }
      if (iVar7 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar17;
      }
      if (iVar7 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_107,(char)((uVar10 & 0x80000) >> 0x13));
        if ((local_d8 & 0x80000) == 0) {
          iVar7 = 1;
          goto LAB_0013be07;
        }
      }
      else {
        _pointy = CONCAT31(uStack_107,1);
      }
      iVar7 = 2;
LAB_0013be07:
      tVar5 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write.significand = &zero;
      write._16_8_ = &pointy;
      write._24_8_ = &local_10b;
      write._32_8_ = &grouping;
      aVar8 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>
                        ((appender)local_f8.container,local_e8,(iVar7 + tVar5) + uVar13,
                         (anon_class_56_7_162c6e41 *)&write);
      return (appender)
             aVar8.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    _pointy = uVar12 - iVar7 & (int)(uVar10 << 0xc) >> 0x1f;
    uVar12 = _pointy;
    if ((int)_pointy < 1) {
      uVar12 = 0;
    }
    tVar5 = to_unsigned<int>(uVar12);
    digit_grouping<char>::digit_grouping(&grouping,local_e0,(bool)((byte)(uVar10 >> 0x11) & 1));
    iVar7 = digit_grouping<char>::count_separators(&grouping,significand_size);
    tVar6 = to_unsigned<int>(iVar7);
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_10b;
    bVar9.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>
                   (local_f8.container,local_e8,local_100 + tVar6 + (ulong)(tVar5 + 1),
                    (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_0013bda9;
  }
  tVar5 = to_unsigned<int>(iVar11);
  loc_00.locale_ = local_e0.locale_;
  lVar14 = tVar5 + local_100;
  _pointy = uVar12 - iVar15;
  uVar10 = (uint)local_d8;
  if ((uVar10 >> 0x13 & 1) != 0) {
    lVar14 = lVar14 + 1;
    if ((char)local_d8 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_0013bd15;
    }
    else {
      _pointy = 1;
    }
    tVar5 = to_unsigned<int>(_pointy);
    lVar14 = lVar14 + (ulong)tVar5;
  }
LAB_0013bd15:
  digit_grouping<char>::digit_grouping(&grouping,loc_00,(bool)((byte)(uVar10 >> 0x11) & 1));
  iVar7 = digit_grouping<char>::count_separators(&grouping,iVar15);
  tVar5 = to_unsigned<int>(iVar7);
  write._0_8_ = &sign;
  write.significand = (char *)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = local_f0;
  write._32_8_ = &grouping;
  bVar9.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>
                 (local_f8.container,local_e8,lVar14 + (ulong)tVar5,
                  (anon_class_72_9_0c6a3a8a *)&write);
LAB_0013bda9:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar9.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}